

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

bool __thiscall
JsUtil::
BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
::TryGetValue<Js::PropertyRecord_const*>
          (BaseDictionary<Js::PropertyRecord_const*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::PropertyRecord_const*>::Entry,JsUtil::NoResizeLock>
           *this,PropertyRecord **key,SimpleDictionaryPropertyDescriptor<unsigned_short> *value)

{
  long lVar1;
  uint uVar2;
  DictionaryStats *this_00;
  uint uVar3;
  
  lVar1 = *(long *)this;
  uVar2 = 0;
  if (lVar1 != 0) {
    uVar2 = BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket((*key)->hash * 2 + 1,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar3 = *(uint *)(lVar1 + (ulong)uVar2 * 4);
    uVar2 = 0;
    if (-1 < (int)uVar3) {
      uVar2 = 0;
      do {
        if (*(PropertyRecord **)(*(long *)(this + 8) + 8 + (ulong)uVar3 * 0x10) == *key) {
          this_00 = *(DictionaryStats **)(this + 0x30);
          goto LAB_00dff798;
        }
        uVar2 = uVar2 + 1;
        uVar3 = *(uint *)((ulong)uVar3 * 0x10 + *(long *)(this + 8) + 4);
      } while (-1 < (int)uVar3);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar3 = 0xffffffff;
LAB_00dff798:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar2);
  }
  if (-1 < (int)uVar3) {
    *value = *(SimpleDictionaryPropertyDescriptor<unsigned_short> *)
              (*(long *)(this + 8) + (ulong)uVar3 * 0x10);
  }
  return -1 < (int)uVar3;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }